

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ipv4_tbl.c
# Opt level: O1

zt_ipv4_node * zt_ipv4_tbl_search_node(zt_ipv4_tbl *tbl,zt_ipv4_node *node)

{
  byte bVar1;
  zt_ipv4_addr *pzVar2;
  zt_ipv4_addr *pzVar3;
  zt_ipv4_node *pzVar4;
  long lVar5;
  int iVar6;
  zt_ipv4_node *pzVar7;
  
  pzVar4 = tbl->any;
  if (pzVar4 == (zt_ipv4_node *)0x0) {
    lVar5 = 0;
    do {
      bVar1 = tbl->in[lVar5];
      if ((ulong)bVar1 == 0) {
        iVar6 = 3;
      }
      else {
        pzVar2 = node->addr;
        iVar6 = 0;
        for (pzVar7 = tbl->tbl[bVar1 - 1][tbl->sz - 1 & netmask_tbl[bVar1] & pzVar2->addr];
            pzVar7 != (zt_ipv4_node *)0x0; pzVar7 = pzVar7->next) {
          if ((((pzVar2 != (zt_ipv4_addr *)0x0) &&
               (pzVar3 = pzVar7->addr, pzVar3 != (zt_ipv4_addr *)0x0)) &&
              (pzVar3->addr <= pzVar2->addr)) && (pzVar2->broadcast <= pzVar3->broadcast)) {
            iVar6 = 1;
            pzVar4 = pzVar7;
            break;
          }
        }
      }
      lVar5 = lVar5 + 1;
    } while (iVar6 == 0);
    if (iVar6 == 3) {
      return (zt_ipv4_node *)0x0;
    }
  }
  return pzVar4;
}

Assistant:

zt_ipv4_node   *
zt_ipv4_tbl_search_node(zt_ipv4_tbl * tbl, zt_ipv4_node * node)
{
    int           bit_iter;
    int           i = 0;
    zt_ipv4_node *match = NULL;

    if (tbl->any) {
        return tbl->any;
    }

    while (1) {
        uint32_t addr_masked;
        uint32_t key;

        bit_iter = tbl->in[i++];

        if (!bit_iter) {
            break;
        }

        addr_masked = node->addr->addr & netmask_tbl[bit_iter];
        key = addr_masked & (tbl->sz - 1);

        match = tbl->tbl[bit_iter - 1][key];

        while (match) {
            if (ipv4_tbl_addr_cmp(match->addr, node->addr)) {
                return match;
            }

            match = match->next;
        }
    }

    return NULL;
}